

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void av1_set_offsets_without_segment_id
               (AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int num_planes_00;
  uint bw;
  uint bh;
  MACROBLOCK *x_00;
  uint in_ECX;
  long in_RDX;
  YV12_BUFFER_CONFIG *in_RSI;
  MACROBLOCK *in_RDI;
  int in_R8D;
  byte in_R9B;
  BLOCK_SIZE unaff_retaddr;
  macroblockd_plane *in_stack_00000008;
  int mi_height;
  int mi_width;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  int in_stack_00000030;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc8;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)(in_RDI[1].picked_ref_frames_mask + 0x1b4);
  num_planes_00 = av1_num_planes(cm_00);
  x_00 = (MACROBLOCK *)(in_RDX + 0x1a0);
  bw = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R9B];
  bh = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R9B];
  set_mode_info_offsets
            ((CommonModeInfoParams *)cm_00,
             (MBMIExtFrameBufferInfo *)CONCAT44(num_planes_00,in_stack_ffffffffffffffc8),x_00,
             (MACROBLOCKD *)
             (ulong)CONCAT14("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [in_R9B],bh),in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  set_entropy_context((MACROBLOCKD *)x_00,in_ECX,in_R8D,num_planes_00);
  (x_00->e_mbd).plane[2].seg_qmatrix[7][3] =
       (cm_00->above_contexts).txfm[(in_RSI->field_2).field_0.y_crop_width] + in_R8D;
  (x_00->e_mbd).plane[2].seg_qmatrix[7][4] =
       (qm_val_t *)((long)(x_00->e_mbd).plane[2].seg_qmatrix[7] + (long)(int)(in_ECX & 0x1f) + 0x28)
  ;
  av1_setup_dst_planes
            (in_stack_00000008,unaff_retaddr,(YV12_BUFFER_CONFIG *)in_RDI,
             (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)in_RDX >> 0x20),in_stack_00000030
            );
  av1_set_mv_limits((CommonModeInfoParams *)x_00,(FullMvLimits *)CONCAT44(bw,bh),
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                    *(int *)((long)in_RDI[1].comp_rd_stats[0x10].dist + 0x14),(int)cm_00);
  set_plane_n4((MACROBLOCKD *)x_00,bw,bh,num_planes_00);
  set_mi_row_col((MACROBLOCKD *)x_00,(TileInfo *)in_RSI,in_ECX,bh,in_R8D,bw,
                 (cm_00->mi_params).mi_rows,(cm_00->mi_params).mi_cols);
  av1_setup_src_planes
            (in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_ECX,
             (BLOCK_SIZE)((uint)in_R8D >> 0x18));
  *(anon_union_8_2_2fc10223_for_yv12_buffer_config_0 *)((x_00->e_mbd).plane[2].seg_qmatrix[5] + 5) =
       in_RSI->field_0;
  *(anon_union_8_2_70c94c84_for_yv12_buffer_config_2 *)((x_00->e_mbd).plane[2].seg_qmatrix[5] + 6) =
       in_RSI->field_1;
  *(anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)((x_00->e_mbd).plane[2].seg_qmatrix[5] + 7) =
       in_RSI->field_2;
  return;
}

Assistant:

void av1_set_offsets_without_segment_id(const AV1_COMP *const cpi,
                                        const TileInfo *const tile,
                                        MACROBLOCK *const x, int mi_row,
                                        int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];

  set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                        mi_row, mi_col);

  set_entropy_context(xd, mi_row, mi_col, num_planes);
  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Set up destination pointers.
  av1_setup_dst_planes(xd->plane, bsize, &cm->cur_frame->buf, mi_row, mi_col, 0,
                       num_planes);

  // Set up limit values for MV components.
  // Mv beyond the range do not produce new/different prediction block.
  av1_set_mv_limits(&cm->mi_params, &x->mv_limits, mi_row, mi_col, mi_height,
                    mi_width, cpi->oxcf.border_in_pixels);

  set_plane_n4(xd, mi_width, mi_height, num_planes);

  // Set up distance of MB to edge of frame in 1/8th pel units.
  assert(!(mi_col & (mi_width - 1)) && !(mi_row & (mi_height - 1)));
  set_mi_row_col(xd, tile, mi_row, mi_height, mi_col, mi_width,
                 cm->mi_params.mi_rows, cm->mi_params.mi_cols);

  // Set up source buffers.
  av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);

  // required by av1_append_sub8x8_mvs_for_idx() and av1_find_best_ref_mvs()
  xd->tile = *tile;
}